

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# messagebox.cpp
# Opt level: O2

int __thiscall QtMWidgets::MsgBoxTitlePrivate::init(MsgBoxTitlePrivate *this,EVP_PKEY_CTX *ctx)

{
  MsgBoxTitle *pMVar1;
  int extraout_EAX;
  QWidget local_30 [8];
  QWidget local_28 [8];
  
  QWidget::setBackgroundRole((ColorRole)this->q);
  QWidget::setAutoFillBackground(SUB81(this->q,0));
  QWidget::setSizePolicy((QSizePolicy)SUB84(this->q,0));
  pMVar1 = this->q;
  FingerGeometry::height();
  QWidget::fontMetrics(local_28);
  QFontMetrics::height();
  QWidget::fontMetrics(local_30);
  QFontMetrics::height();
  QWidget::setMinimumHeight((int)pMVar1);
  QFontMetrics::~QFontMetrics((QFontMetrics *)local_30);
  QFontMetrics::~QFontMetrics((QFontMetrics *)local_28);
  prepareTitle(this);
  return extraout_EAX;
}

Assistant:

void
MsgBoxTitlePrivate::init()
{
	q->setBackgroundRole( QPalette::Window );
	q->setAutoFillBackground( true );
	q->setSizePolicy( QSizePolicy::Expanding, QSizePolicy::Fixed );
	q->setMinimumHeight( qMax( FingerGeometry::height(),
		q->fontMetrics().height() + q->fontMetrics().height() / 3 ) );

	prepareTitle();
}